

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O1

void __thiscall
TPZGenSubStruct::InitializeDohrCondense
          (TPZGenSubStruct *this,TPZAutoPointer<TPZMatrix<double>_> *dohrmatrix,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  TPZMatrix<double> *pTVar1;
  TPZVec<int> *pTVar2;
  int *piVar3;
  int *piVar4;
  TPZGenSubStruct *this_00;
  long *plVar5;
  int64_t iVar6;
  TPZSubCompMesh *pTVar7;
  TPZDohrSubstructCondense<double> *this_01;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  _List_node_base *p_Var10;
  ulong uVar11;
  TPZDohrAssembly<double> *dohrassembly;
  uint uVar12;
  undefined **ppuVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> substruct;
  TPZVec<std::pair<int,_int>_> globaleqs;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> globinv;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_f0;
  key_type local_e8;
  _func_int **local_e0;
  TPZGenSubStruct *local_d8;
  TPZSubCompMesh *local_d0;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_c8;
  TPZAutoPointer<TPZCompMesh> local_c0;
  ulong local_b8;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_b0;
  TPZAutoPointer<TPZCompMesh> local_a8;
  TPZVec<std::pair<int,_int>_> local_a0;
  long *local_80;
  long *local_78;
  ulong local_70;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  key_type local_38;
  
  pTVar1 = dohrmatrix->fRef->fPointer;
  if (pTVar1 == (TPZMatrix<double> *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(pTVar1,&TPZMatrix<double>::typeinfo,
                                    &TPZDohrMatrix<double,TPZDohrSubstructCondense<double>>::
                                     typeinfo,0);
  }
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x78))();
  iVar6 = TPZCompMesh::NEquations(((this->fCMesh).fRef)->fPointer);
  (**(code **)(*plVar5 + 0x68))(plVar5,(long)(int)iVar6);
  *(int *)(plVar5 + 7) = (int)(this->fCornerEqs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_a8.fRef = (this->fCMesh).fRef;
  LOCK();
  ((local_a8.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_a8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d8 = this;
  iVar6 = NSubMesh(&local_a8);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_a8);
  uVar12 = (uint)iVar6;
  TPZVec<TPZVec<int>_>::Resize(&assembly->fRef->fPointer->fFineEqs,(long)(int)uVar12);
  TPZVec<TPZVec<int>_>::Resize(&assembly->fRef->fPointer->fCoarseEqs,(long)(int)uVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Computing the system of equations for each substructure\n",0x38)
  ;
  if (0 < (int)uVar12) {
    local_80 = plVar5 + 4;
    uVar11 = (ulong)(uVar12 & 0x7fffffff);
    ppuVar13 = &PTR__TPZVec_018e53c8;
    uVar14 = 0;
    local_e0 = (_func_int **)&PTR__TPZVec_018e53c8;
    local_78 = plVar5;
    local_70 = uVar11;
    do {
      local_c0.fRef = (local_d8->fCMesh).fRef;
      LOCK();
      ((local_c0.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_c0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_b8 = uVar14;
      pTVar7 = SubMesh(&local_c0,(int)uVar14);
      TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_c0);
      local_d0 = pTVar7;
      if (pTVar7 != (TPZSubCompMesh *)0x0) {
        local_68._M_impl._0_1_ = 0x2a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_68,1);
        std::ostream::flush();
        this_01 = (TPZDohrSubstructCondense<double> *)operator_new(0x450);
        TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(this_01);
        local_f0.fRef = (TPZReference *)operator_new(0x10);
        pTVar7 = local_d0;
        *(undefined4 *)&((_List_node_base *)local_f0.fRef)->_M_prev = 0;
        ((_List_node_base *)local_f0.fRef)->_M_next = (_List_node_base *)this_01;
        LOCK();
        *(undefined4 *)&((_List_node_base *)local_f0.fRef)->_M_prev = 1;
        UNLOCK();
        iVar6 = TPZCompMesh::NEquations(&local_d0->super_TPZCompMesh);
        uVar12 = (uint)iVar6;
        (local_f0.fRef)->fPointer->fNEquations = uVar12;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a0.fNAlloc = 0;
        local_a0.fStore = (pair<int,_int> *)0x0;
        local_a0.fNElements = 0;
        local_a0._vptr_TPZVec = (_func_int **)ppuVar13;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        IdentifyEqNumbers(local_d8,pTVar7,&local_a0,
                          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_68);
        uVar14 = local_b8;
        uVar16 = (uint)local_a0.fNElements;
        (local_f0.fRef)->fPointer->fNumExternalEquations = uVar16;
        pTVar2 = (assembly->fRef->fPointer->fFineEqs).fStore;
        (*pTVar2[local_b8]._vptr_TPZVec[3])(pTVar2 + local_b8,(long)(int)uVar16);
        if (0 < (int)uVar16) {
          piVar3 = (assembly->fRef->fPointer->fFineEqs).fStore[uVar14].fStore;
          uVar11 = 0;
          do {
            piVar3[uVar11] = local_a0.fStore[uVar11].second;
            uVar11 = uVar11 + 1;
          } while ((uVar16 & 0x7fffffff) != uVar11);
        }
        local_e8.first = Submesh;
        local_e8.second = ExternalFirst;
        pmVar8 = std::
                 map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                 ::operator[](&(local_f0.fRef)->fPointer->fPermutationsScatter,&local_e8);
        local_e8.first = ExternalFirst;
        local_e8.second = Submesh;
        pmVar9 = std::
                 map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                 ::operator[](&(local_f0.fRef)->fPointer->fPermutationsScatter,&local_e8);
        local_e8.first = ~Submesh;
        (*pmVar8->_vptr_TPZVec[2])(pmVar8,(long)(int)uVar12,&local_e8);
        local_e8.first = ~Submesh;
        (*pmVar9->_vptr_TPZVec[2])(pmVar9,(long)(int)uVar12,&local_e8);
        ppuVar13 = local_e0;
        if (0 < (int)(uint)local_a0.fNElements) {
          piVar3 = pmVar8->fStore;
          uVar11 = 0;
          do {
            piVar3[local_a0.fStore[uVar11].first] = (int)uVar11;
            uVar11 = uVar11 + 1;
          } while (((uint)local_a0.fNElements & 0x7fffffff) != uVar11);
        }
        if (0 < (int)uVar12) {
          piVar3 = pmVar8->fStore;
          uVar15 = 0;
          uVar11 = local_a0.fNElements;
          do {
            if (piVar3[uVar15] == -1) {
              piVar3[uVar15] = (int)uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            }
            uVar15 = uVar15 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar15);
        }
        if (0 < (int)uVar12) {
          piVar3 = pmVar8->fStore;
          piVar4 = pmVar9->fStore;
          uVar11 = 0;
          do {
            piVar4[piVar3[uVar11]] = (int)uVar11;
            uVar11 = uVar11 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar11);
        }
        local_e8.first = Submesh;
        local_e8.second = InternalFirst;
        pmVar8 = std::
                 map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                 ::operator[](&(local_f0.fRef)->fPointer->fPermutationsScatter,&local_e8);
        local_38.first = InternalFirst;
        local_38.second = Submesh;
        pmVar9 = std::
                 map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                 ::operator[](&(local_f0.fRef)->fPointer->fPermutationsScatter,&local_38);
        uVar11 = local_70;
        this_00 = local_d8;
        ComputeInternalEquationPermutation(local_d0,pmVar8,pmVar9);
        IdentifySubCornerEqs
                  (this_00,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_68,&(local_f0.fRef)->fPointer->fCoarseNodes,
                   (assembly->fRef->fPointer->fCoarseEqs).fStore + uVar14);
        local_b0.fRef = local_f0.fRef;
        LOCK();
        ((local_f0.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_f0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        InitializeMatrices(local_d0,&local_b0,dohrassembly);
        plVar5 = local_78;
        TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_b0);
        local_c8.fRef = local_f0.fRef;
        LOCK();
        ((local_f0.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_f0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = (_List_node_base *)local_c8.fRef;
        LOCK();
        ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i =
             ((local_c8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        std::__detail::_List_node_base::_M_hook(p_Var10);
        plVar5[6] = plVar5[6] + 1;
        TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_c8);
        local_a0._vptr_TPZVec = (_func_int **)ppuVar13;
        if (local_a0.fStore != (pair<int,_int> *)0x0) {
          operator_delete__(local_a0.fStore);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_68);
        TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_f0);
      }
      uVar14 = local_b8 + 1;
    } while (uVar14 != uVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void TPZGenSubStruct::InitializeDohrCondense(TPZAutoPointer<TPZMatrix<STATE> > dohrmatrix, TPZAutoPointer<TPZDohrAssembly<STATE> > assembly)
{
	//Isolate each subcompmesh and put it in the dohrmann matrix
	TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *dohr = dynamic_cast<TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *>(dohrmatrix.operator->());
	fCMesh->ComputeNodElCon();
	
	int neq = fCMesh->NEquations();
	dohr->Resize(neq,neq);
	// fCornerEqs was initialized during the mesh generation process
    dohr->SetNumCornerEqs(this->fCornerEqs.size());
	
	int nsub = NSubMesh(fCMesh);
	assembly->fFineEqs.Resize(nsub);
	assembly->fCoarseEqs.Resize(nsub);
	int isub;
	std::cout << "Computing the system of equations for each substructure\n";
	for(isub=0; isub<nsub; isub++)
	{
		TPZSubCompMesh *submesh = SubMesh(fCMesh, isub);
		if(!submesh) 
		{
			continue;
		}
		std::cout << '*';
		// creating the substructure HERE
		std::cout.flush();
		TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct = new TPZDohrSubstructCondense<STATE>();

		// compute the stiffness matrix
		int neq = ((TPZCompMesh *)submesh)->NEquations();
		//    int neq = substruct->fStiffness->Rows();
		
		substruct->fNEquations = neq;

		// identify the equation numbers of the submesh
		std::map<int,int> globinv;
		// initialize the fGlobalIndex data structure
		// fGlobalIndex will have -1 entries for internal equations
		// we need to dismember this (again) in two vectors
		TPZVec<std::pair<int,int> > globaleqs;
		IdentifyEqNumbers(submesh, globaleqs ,globinv);
		int next = globaleqs.NElements();
		substruct->fNumExternalEquations = next;
		assembly->fFineEqs[isub].Resize(next);
		int ieq;
		for(ieq=0; ieq<next; ieq++)
		{
			assembly->fFineEqs[isub][ieq] = globaleqs[ieq].second; 
		}
		
		// initialize the permutations from the mesh enumeration to the external enumeration
		typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
		typedef std::pair<ENumbering,ENumbering> Numberingpair;
		ENumbering tsub,text,tint;
		tsub = TPZDohrSubstructCondense<STATE>::Submesh;
		text = TPZDohrSubstructCondense<STATE>::ExternalFirst;
		tint = TPZDohrSubstructCondense<STATE>::InternalFirst;
		
		TPZVec<int> &toexternal = substruct->fPermutationsScatter[Numberingpair(tsub,text)];
		TPZVec<int> &fromexternal = substruct->fPermutationsScatter[Numberingpair(text,tsub)];
		toexternal.Resize(neq,-1);
		fromexternal.Resize(neq,-1);
		int nel = globaleqs.NElements();
		
		for(ieq=0; ieq<nel; ieq++)
		{
			toexternal[globaleqs[ieq].first] = ieq;
		}
		int count = nel++;
		for(ieq=0; ieq<neq; ieq++)
		{
			if(toexternal[ieq] == -1) toexternal[ieq] = count++;
		}
		for(ieq=0; ieq<neq; ieq++)
		{
			fromexternal[toexternal[ieq]] = ieq;
		}
		
		ComputeInternalEquationPermutation(submesh, substruct->fPermutationsScatter[Numberingpair(tsub,tint)], substruct->fPermutationsScatter[Numberingpair(tint,tsub)]);
		//		IdentifyEqNumbers(submesh, substruct->fGlobalIndex,globinv);
		
		// initialize the fC matrix
		// associate each column of the fC matrix with a coarse index
		IdentifySubCornerEqs(globinv,substruct->fCoarseNodes,assembly->fCoarseEqs[isub]);
		//		int ncoarse = substruct->fCoarseNodes.NElements();
		
		// reorder by internal nodes
		// the fInternalEqs data structure will not be filled if the connects are made internal
		
		// this permutes the nodes of the submesh
		// This is a lengthy process which should run on the remote processor
		InitializeMatrices(submesh, substruct,  assembly);
		
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "The coarse equations are " << assembly->fCoarseEqs[isub] << std::endl;
			/*      sout << "Submesh for element " << iel << std::endl;
			 submesh->Print(sout);*/
			sout << "Substructure for submesh " << isub << std::endl;
			substruct->Print(sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		dohr->AddSubstruct(substruct);
	}
	std::cout << std::endl;
}